

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O2

boolean replay_run_cmdloop(boolean optonly,boolean singlestep,boolean fast)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  boolean bVar4;
  nh_option_desc *pnVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  byte *out;
  memfile_tag *pmVar13;
  bool bVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  undefined7 in_register_00000011;
  uint uVar18;
  char *pcVar19;
  byte *pbVar20;
  ulong uVar21;
  undefined7 in_register_00000031;
  size_t __size;
  memfile_tag *pmVar22;
  char cVar23;
  ulong uVar24;
  nh_cmd_arg cmdarg;
  nh_optvalue local_2118;
  uint local_210c;
  undefined4 local_2108;
  int count;
  long local_2100;
  char valbuf [256];
  char optname [256];
  
  pnVar5 = birth_options;
  local_2108 = (undefined4)CONCAT71(in_register_00000011,fast);
  uVar24 = CONCAT71(in_register_00000031,singlestep) & 0xffffffff;
  birth_options = active_birth_options;
  active_birth_options = pnVar5;
  pcVar10 = next_log_token();
  pcVar10 = strdupnull(pcVar10);
  cVar23 = (char)uVar24;
  bVar4 = '\0';
  local_210c = (uint)CONCAT71(in_register_00000031,singlestep);
  do {
    pnVar5 = birth_options;
    if (pcVar10 == (char *)0x0) {
      birth_options = active_birth_options;
      active_birth_options = pnVar5;
      return bVar4;
    }
    cVar1 = *pcVar10;
    if (cVar1 == '~') {
      if (cVar23 != '\0' || optonly == '\0') {
        pcVar11 = next_log_token();
        if ((pcVar11 != (char *)0x0) && (loginfo.diffs_are_invalid == '\0')) {
          if ((*pcVar11 != 'f') || (pcVar11[1] != ':')) {
            parse_error("Error: incorrect binary diff format.\n");
          }
          iVar8 = base64_strlen(pcVar11 + 2);
          out = (byte *)calloc(1,(long)(iVar8 + 2));
          base64_decode(pcVar11 + 2,(char *)out);
          mnew((memfile *)optname,(memfile *)0x0);
          local_2100 = (long)iVar8;
          pbVar20 = out;
          iVar8 = 0;
          while( true ) {
            bVar2 = pbVar20[1];
            if (*pbVar20 == 0 && bVar2 == 0) break;
            bVar3 = bVar2 >> 6;
            uVar7 = (bVar2 & 0x3f) << 8;
            uVar18 = *pbVar20 | uVar7;
            if (bVar3 - 1 < 2) {
              __size = (size_t)(int)optname._8_4_;
              bVar14 = true;
              while ((int)__size < (int)(optname._12_4_ + uVar18)) {
                __size = __size + 0x1000;
                optname._8_4_ = (undefined4)__size;
                bVar14 = false;
              }
              if (!bVar14) {
                optname._0_8_ = realloc((void *)optname._0_8_,__size);
              }
              uVar24 = (ulong)uVar18;
              if (bVar3 == 1) {
                if (diff_base.pos < (int)(uVar18 + iVar8)) {
                  free(out);
                  mfree((memfile *)optname);
                  parse_error("binary diff reads past EOF");
                }
                memcpy((void *)((long)(int)optname._12_4_ + optname._0_8_),diff_base.buf + iVar8,
                       uVar24);
                optname._12_4_ = optname._12_4_ + uVar18;
                pbVar20 = pbVar20 + 2;
                iVar8 = uVar18 + iVar8;
              }
              else {
                pbVar20 = pbVar20 + 2;
                if (local_2100 < (long)(pbVar20 + (uVar24 - (long)out))) {
                  free(out);
                  mfree((memfile *)optname);
                  parse_error("binary diff ends unexpectedly");
                }
                memcpy((void *)((long)(int)optname._12_4_ + optname._0_8_),pbVar20,uVar24);
                optname._12_4_ = optname._12_4_ + uVar18;
                pbVar20 = pbVar20 + uVar24;
                iVar8 = iVar8 + uVar18;
              }
            }
            else {
              if (bVar3 != 0) {
                free(out);
                mfree((memfile *)optname);
                parse_error("unknown command in binary diff");
              }
              uVar15 = uVar18 - 0x4000;
              if (uVar7 < 0x2000) {
                uVar15 = uVar18;
              }
              if (iVar8 < (int)uVar15) {
                free(out);
                mfree((memfile *)optname);
                parse_error("diff seeks past start of file");
              }
              pbVar20 = pbVar20 + 2;
              iVar8 = iVar8 - uVar15;
            }
          }
          if (optonly == '\0') {
            uVar24 = (ulong)local_210c;
            if ((char)local_2108 == '\0') {
              mfree(&diff_base);
              mnew(&diff_base,(memfile *)0x0);
              if (loginfo.cmds_are_invalid == '\0') {
                savegame(&diff_base);
              }
              uVar6 = optname._12_4_;
              iVar8 = diff_base.pos;
              if ((diff_base.pos == optname._12_4_) &&
                 (iVar9 = bcmp(diff_base.buf,(void *)optname._0_8_,(long)diff_base.pos), iVar9 == 0)
                 ) {
                mfree((memfile *)optname);
              }
              else {
                if (loginfo.cmds_are_invalid == '\0' && uVar6 == iVar8) {
                  valbuf[8] = 'c';
                  valbuf[9] = '\0';
                  valbuf[10] = '\0';
                  valbuf[0xb] = '\0';
                  valbuf[0xc] = '\0';
                  valbuf[0xd] = '\0';
                  valbuf[0xe] = '\0';
                  valbuf[0xf] = '\0';
                  valbuf[0x10] = '\0';
                  valbuf[0x11] = '\0';
                  valbuf[0x12] = '\0';
                  valbuf[0x13] = '\0';
                  valbuf[0x14] = '\0';
                  valbuf[0x15] = '\0';
                  valbuf[0x16] = '\0';
                  valbuf[0x17] = '\0';
                  uVar21 = (ulong)(uint)iVar8;
                  if (iVar8 < 1) {
                    uVar21 = 0;
                  }
                  uVar17 = 0;
LAB_001b232a:
                  if (uVar21 != uVar17) {
                    if (*(char *)(optname._0_8_ + uVar17) == diff_base.buf[uVar17]) break;
                    pmVar13 = (memfile_tag *)valbuf;
                    for (lVar16 = 0; lVar16 != 0x3f1; lVar16 = lVar16 + 1) {
                      pmVar22 = (memfile_tag *)(diff_base.tags + lVar16);
                      while (pmVar22 = pmVar22->next, pmVar22 != (memfile_tag *)0x0) {
                        if ((pmVar22->pos <= (int)uVar17) && (pmVar13->pos <= pmVar22->pos)) {
                          pmVar13 = pmVar22;
                        }
                      }
                    }
                    raw_printf("desync between recording and save at tag (%d, %ld) + %d bytes",
                               (ulong)pmVar13->tagtype,pmVar13->tagdata,
                               (ulong)(uint)((int)uVar17 - pmVar13->pos));
                  }
                  goto LAB_001b238b;
                }
                if (loginfo.cmds_are_invalid == '\0') {
                  raw_printf("desync between recording (length %d) and recorded save (length %d)",
                             (ulong)(uint)iVar8,(ulong)(uint)uVar6);
                }
LAB_001b238b:
                loginfo.out_of_sync = '\x01';
                mfree(&diff_base);
                memcpy(&diff_base,optname,0x1fc0);
                replay_sync_save();
                if (loginfo.cmds_are_invalid == '\0' && loginfo.diffs_are_invalid == '\0') {
                  loginfo.cmds_are_invalid = '\x01';
                  raw_printf(
                            "The recorded commands seem to be invalid.  Replay will use diffs instead."
                            );
                }
              }
            }
            else {
              loginfo.out_of_sync = '\x01';
              mfree(&diff_base);
              memcpy(&diff_base,optname,0x1fc0);
            }
          }
          else {
            mfree(&diff_base);
            memcpy(&diff_base,optname,0x1fc0);
            uVar24 = (ulong)local_210c;
          }
          free(out);
        }
        pnVar5 = active_birth_options;
        if ((char)uVar24 != '\0') {
          active_birth_options = birth_options;
          birth_options = pnVar5;
          return bVar4;
        }
      }
      goto LAB_001b2258;
    }
    if (cVar1 == '-') {
      if (((optonly == '\0') && (program_state.viewing != 0)) && (loginfo.cmds_are_invalid != '\0'))
      {
        if (pcVar10[1] != '-') {
          parse_error("Error: incorrect message format");
        }
        iVar8 = base64_strlen(pcVar10 + 2);
        pcVar11 = (char *)calloc(1,(long)(iVar8 + 2));
        base64_decode(pcVar10 + 2,pcVar11);
        pline("%s",pcVar11);
        free(pcVar11);
      }
      goto LAB_001b2258;
    }
    if (cVar1 == '<') {
      if ((optonly == '\0') && (loginfo.cmds_are_invalid == '\0')) {
        iVar8 = __isoc99_sscanf(pcVar10,"<%x",optname);
        if (iVar8 != 1) {
          parse_error("Error: incorrect command result specification\n");
        }
        uVar6 = optname._0_4_;
        uVar7 = mt_nextstate();
        if (uVar6 != (uVar7 & 0xffff)) {
          loginfo.cmds_are_invalid = '\x01';
          raw_printf("The recorded commands seem to be invalid.  Replay will use diffs instead.");
        }
      }
      goto LAB_001b2258;
    }
    if (cVar1 == '>') {
      if (loginfo.cmds_are_invalid == '\0' && optonly == '\0') {
        iVar8 = __isoc99_sscanf(pcVar10,">%n",valbuf);
        if (((iVar8 == -1) || (valbuf._0_4_ == 0)) ||
           (iVar8 = sscan_llx(pcVar10 + (int)valbuf._0_4_,&turntime), iVar8 == 0)) {
LAB_001b24bb:
          parse_error("Error: Incorrect command spec\n");
        }
        lVar16 = (long)(int)valbuf._0_4_;
        valbuf._0_4_ = (undefined4)(iVar8 + lVar16);
        iVar8 = __isoc99_sscanf(pcVar10 + iVar8 + lVar16,":%x:%d",optname,&count);
        if (iVar8 < 2) goto LAB_001b24bb;
        if (cmdcount < (int)optname._0_4_) goto LAB_001b24bb;
        pcVar11 = commands[(int)optname._0_4_];
        pcVar12 = next_log_token();
        if (pcVar12 == (char *)0x0) goto LAB_001b24d3;
        cVar1 = *pcVar12;
        if (cVar1 == 'd') {
          cmdarg.argtype = 4;
          pcVar19 = "d:%d";
LAB_001b2198:
          iVar8 = __isoc99_sscanf(pcVar12,pcVar19,&cmdarg.field_1);
          if (iVar8 != 1) {
LAB_001b24d3:
            parse_error("Bad command argument");
          }
        }
        else if (cVar1 == 'p') {
          cmdarg.argtype = 8;
          iVar8 = __isoc99_sscanf(pcVar12,"p:%hx:%hx",&cmdarg.field_1,
                                  (undefined1 *)((long)&cmdarg.field_1 + 2));
          if (iVar8 != 2) goto LAB_001b24d3;
        }
        else {
          if (cVar1 == 'o') {
            cmdarg.argtype = 0x10;
            pcVar19 = "o:%c";
            goto LAB_001b2198;
          }
          if (cVar1 != 'n') {
            parse_error("unrecognized arg type");
          }
          cmdarg.argtype = 2;
        }
        iVar8 = get_command_idx(pcVar11);
        command_input(iVar8,count,&cmdarg);
      }
      if (optonly == '\0') {
        bVar4 = '\x01';
      }
      goto LAB_001b2258;
    }
    if (cVar1 == 'T') {
      iVar8 = __isoc99_sscanf(pcVar10,"TZ%d",&replay_timezone);
      if (iVar8 != 1) {
        parse_error("Bad timezone offset data.");
      }
      goto LAB_001b2258;
    }
    if (cVar1 != '!') goto LAB_001b2258;
    pcVar11 = strchr(pcVar10 + 1,0x3a);
    if (pcVar11 == (char *)0x0) {
LAB_001b24b6:
      terminate();
    }
    *pcVar11 = '\0';
    pcVar12 = strchr(pcVar11 + 1,0x3a);
    if (pcVar12 == (char *)0x0) goto LAB_001b24b6;
    pcVar19 = pcVar12 + 1;
    *pcVar12 = '\0';
    base64_decode(pcVar10 + 1,optname);
    cVar1 = pcVar11[1];
    switch(cVar1) {
    case 'a':
      iVar8 = base64_strlen(pcVar19);
      pcVar11 = (char *)calloc((long)(iVar8 + 1),1);
      base64_decode(pcVar19,pcVar11);
      local_2118.ar = parse_autopickup_rules(pcVar11);
LAB_001b2149:
      free(pcVar11);
      break;
    case 'b':
      iVar8 = atoi(pcVar19);
      local_2118.b = (char)iVar8;
      break;
    case 'c':
    case 'd':
    case 'f':
    case 'g':
    case 'h':
switchD_001b1c90_caseD_63:
      parse_error("Unrecognized option type");
    case 'e':
      pcVar11 = "%x";
      goto LAB_001b2110;
    case 'i':
      pcVar11 = "%d";
LAB_001b2110:
      __isoc99_sscanf(pcVar19,pcVar11,&local_2118);
      break;
    default:
      if (cVar1 == 'm') {
        iVar8 = base64_strlen(pcVar19);
        pcVar11 = (char *)calloc((long)(iVar8 + 1),1);
        base64_decode(pcVar19,pcVar11);
        local_2118.mt = parse_msgtype_rules(pcVar11);
        goto LAB_001b2149;
      }
      if (cVar1 != 's') goto switchD_001b1c90_caseD_63;
      base64_decode(pcVar19,valbuf);
      local_2118.s = (char *)0x0;
      if (valbuf[0] != '\0') {
        local_2118.s = valbuf;
      }
    }
    nh_set_option(optname,local_2118,'\0');
LAB_001b2258:
    free(pcVar10);
    pcVar10 = next_log_token();
    pcVar10 = strdupnull(pcVar10);
  } while( true );
  uVar17 = uVar17 + 1;
  goto LAB_001b232a;
}

Assistant:

boolean replay_run_cmdloop(boolean optonly, boolean singlestep, boolean fast)
{
    char *cmd, *token;
    int count, cmdidx;
    struct nh_cmd_arg cmdarg;
    struct nh_option_desc *tmp;
    boolean did_action = FALSE;
    
    /* the log contains the birth options that are required for this game,
     * so nh_set_option calls during the replay must change active_birth_options */
    tmp = birth_options;
    birth_options = active_birth_options;
    active_birth_options = tmp;

    token = strdupnull(next_log_token());

    while (token) {
	switch (token[0]) {
	    case '!': /* Option */
		replay_read_option(token);
		break;
		
	    case 'T': /* timezone offset */
		replay_read_timezone(token);
		break;
		
	    case '>': /* command */
		if (!optonly && !loginfo.cmds_are_invalid) {
		    replay_read_command(token, &cmd, &count, &cmdarg);
		    cmdidx = get_command_idx(cmd);
		    command_input(cmdidx, count, &cmdarg);
		}
		if (!optonly)
		    did_action = TRUE;
		break;
		
	    case '<': /* a command result */
		if (!optonly)
		    replay_check_cmdresult(token);
		break;

	    case '~': /* a diff */
		if (!optonly || singlestep)
		    replay_check_diff(next_log_token(), optonly, fast);
		if (singlestep)
		    goto out;
		break;

	    case '-': /* a message */
		/* We want to display the welcome messages in the
		 * new-game sequence even if recovering from diffs. */
		if (program_state.viewing && loginfo.cmds_are_invalid && !optonly)
		    replay_check_msg(token);
		break;
	}
	free(token);
	token = strdupnull(next_log_token());
    }

out:
    /* return the birth options to normal */
    tmp = birth_options;
    birth_options = active_birth_options;
    active_birth_options = tmp;
    
    return did_action;
}